

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadPayload(CrateReader *this,Payload *d)

{
  bool bVar1;
  value_type *rhs;
  ostream *poVar2;
  PathIndex index;
  string assetPath;
  ostringstream ss_e;
  optional<tinyusdz::Path> path;
  Index local_2bc;
  string local_2b8 [2];
  optional<tinyusdz::Path> local_278;
  optional<tinyusdz::Path> local_f8;
  
  if (d == (Payload *)0x0) {
    return false;
  }
  local_2b8[0]._M_dataplus._M_p = (pointer)&local_2b8[0].field_2;
  local_2b8[0]._M_string_length = 0;
  local_2b8[0].field_2._M_local_buf[0] = '\0';
  bVar1 = ReadString(this,local_2b8);
  if (bVar1) {
    local_2bc.value = 0xffffffff;
    bVar1 = ReadIndex(this,&local_2bc);
    if (bVar1) {
      GetPath(&local_278,this,local_2bc);
      nonstd::optional_lite::optional<tinyusdz::Path>::optional<tinyusdz::Path,_0>
                (&local_f8,&local_278);
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_278);
      if (local_f8.has_value_ == false) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        poVar2 = ::std::operator<<((ostream *)&local_278,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadPayload");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x420);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)&local_278,"Invalid Path index in Payload ValueRep.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)&this->_err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
LAB_00183e13:
        bVar1 = false;
      }
      else {
        if ((this->_version[0] != '\0') || (7 < this->_version[1])) {
          local_278.has_value_ = false;
          local_278._1_3_ = 0;
          local_278._4_4_ = 0;
          local_278.contained._0_4_ = 0;
          local_278.contained._4_4_ = 0x3ff00000;
          bVar1 = ReadLayerOffset(this,(LayerOffset *)&local_278);
          if (!bVar1) goto LAB_00183e13;
          (d->layerOffset)._offset = (double)CONCAT44(local_278._4_4_,local_278._0_4_);
          (d->layerOffset)._scale =
               (double)CONCAT44(local_278.contained._4_4_,local_278.contained._0_4_);
        }
        tinyusdz::value::AssetPath::AssetPath((AssetPath *)&local_278,local_2b8);
        tinyusdz::value::AssetPath::operator=(&d->asset_path,(AssetPath *)&local_278);
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&local_278);
        rhs = nonstd::optional_lite::optional<tinyusdz::Path>::value(&local_f8);
        Path::operator=(&d->prim_path,rhs);
        bVar1 = true;
      }
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_f8);
      goto LAB_00183e22;
    }
  }
  bVar1 = false;
LAB_00183e22:
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool CrateReader::ReadPayload(Payload *d) {

  if (!d) {
    return false;
  }

  // assetPath : string
  // primPath : Path

  std::string assetPath;
  if (!ReadString(&assetPath)) {
    return false;
  }


  crate::PathIndex index;
  if (!ReadIndex(&index)) {
    return false;
  }

  auto path = GetPath(index);
  if (!path) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Path index in Payload ValueRep.");
  }

  // LayerOffset from 0.8.0
  if (VersionGreaterThanOrEqualTo_0_8_0()) {
    LayerOffset layerOffset;
    if (!ReadLayerOffset(&layerOffset)) {
      return false;
    }
    d->layerOffset = layerOffset;
  }

  d->asset_path = assetPath;
  d->prim_path = path.value();

  return true;
}